

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O3

void Arguments_create_from_string(Arguments *args,char *argstring)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char **ppcVar5;
  size_t sVar6;
  char cVar7;
  
  if (args == (Arguments *)0x0) {
    __assert_fail("args != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/arguments.c"
                  ,0x3f,"void Arguments_create_from_string(Arguments *, const char *)");
  }
  if (argstring != (char *)0x0) {
    sVar3 = strlen(argstring);
    pcVar4 = (char *)malloc(sVar3 + 1);
    args->argstring = pcVar4;
    memcpy(pcVar4,argstring,sVar3 + 1);
    ppcVar5 = (char **)malloc(sVar3 * 8);
    args->argv_unconsumed = ppcVar5;
    *ppcVar5 = pcVar4 + sVar3;
    args->argc = 1;
    if (sVar3 != 0) {
      sVar6 = 0;
      bVar2 = true;
      do {
        pcVar4 = args->argstring;
        cVar7 = pcVar4[sVar6];
        if ((cVar7 == ' ') || (cVar7 == '\t')) {
          pcVar4[sVar6] = '\0';
          pcVar4 = args->argstring;
          cVar7 = pcVar4[sVar6];
        }
        if (bVar2 && cVar7 != '\0') {
          iVar1 = args->argc;
          args->argv_unconsumed[iVar1] = pcVar4 + sVar6;
          args->argc = iVar1 + 1;
        }
        sVar6 = sVar6 + 1;
        bVar2 = cVar7 == '\0';
      } while (sVar3 != sVar6);
    }
    return;
  }
  __assert_fail("argstring != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/arguments.c"
                ,0x40,"void Arguments_create_from_string(Arguments *, const char *)");
}

Assistant:

void Arguments_create_from_string( Arguments*  args,
                                   const char* argstring )
{
  Assert( args != NULL );
  Assert( argstring != NULL );

  size_t len = strlen( argstring );

  args->argstring = (char*) malloc( (len+1) * sizeof( char ) );
  memcpy( args->argstring, argstring, len+1 );

  args->argv_unconsumed = (char**) malloc( len * sizeof( char* ) );

  args->argv_unconsumed[0] = & args->argstring[len];
  args->argc = 1;

  /*---Parse string, convert to args---*/
  Bool_t is_delim_prev = Bool_true;
  int i = 0;
  for( i=0; i<len; ++i )
  {
    if( args->argstring[i] == ' ' || args->argstring[i] == '\t' )
    {
      args->argstring[i] = 0;
    }
    Bool_t is_delim = args->argstring[i] == 0;
    if( is_delim_prev && ! is_delim )
    {
      args->argv_unconsumed[args->argc] = & args->argstring[i];
      args->argc++;
    }
    is_delim_prev = is_delim;
  }
}